

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O2

void __thiscall
Assimp::PLYImporter::LoadVertex
          (PLYImporter *this,Element *pcElement,ElementInstance *instElement,uint pos)

{
  uint uVar1;
  pointer pPVar2;
  PropertyInstance *pPVar3;
  aiMesh *paVar4;
  aiVector3D *paVar5;
  aiColor4D *paVar6;
  EDataType eType;
  int idx;
  ulong uVar7;
  EDataType eType_00;
  ulong uVar8;
  int idx_00;
  int iVar9;
  int iVar10;
  int idx_01;
  int idx_02;
  int idx_03;
  int idx_04;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  int local_80;
  EDataType local_7c;
  EDataType local_78;
  int local_74;
  int local_70;
  int local_6c;
  float local_5c;
  float local_58;
  EDataType local_50;
  EDataType local_4c;
  EDataType local_48;
  EDataType local_44;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("nullptr != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyLoader.cpp"
                  ,0x116,
                  "void Assimp::PLYImporter::LoadVertex(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  if (instElement == (ElementInstance *)0x0) {
    __assert_fail("nullptr != instElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Ply/PlyLoader.cpp"
                  ,0x117,
                  "void Assimp::PLYImporter::LoadVertex(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  pPVar2 = (pcElement->alProperties).
           super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_44 = EDT_Char;
  idx_03 = -1;
  local_88 = -NAN;
  local_78 = EDT_Char;
  local_90 = 0.0;
  local_8c = 0.0;
  idx_01 = -1;
  eType_00 = EDT_Char;
  eType = EDT_Char;
  iVar10 = 0;
  iVar9 = 0;
  local_48 = EDT_Char;
  local_4c = EDT_Char;
  local_94 = 0.0;
  idx_02 = -1;
  local_7c = EDT_Char;
  local_98 = 0.0;
  local_50 = EDT_Char;
  idx_00 = -1;
  idx = -1;
  idx_04 = -1;
  local_84 = local_88;
  local_80 = (int)local_88;
  local_74 = (int)local_88;
  local_70 = (int)local_88;
  local_6c = (int)local_88;
  for (; pPVar2 != (pcElement->alProperties).
                   super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pPVar2 = pPVar2 + 1) {
    if (pPVar2->bIsList == false) {
      switch(pPVar2->Semantic) {
      case EST_XCoord:
        iVar9 = iVar9 + 1;
        local_50 = pPVar2->eType;
        idx_00 = iVar10;
        break;
      case EST_YCoord:
        iVar9 = iVar9 + 1;
        local_98 = (float)pPVar2->eType;
        idx = iVar10;
        break;
      case EST_ZCoord:
        iVar9 = iVar9 + 1;
        local_7c = pPVar2->eType;
        idx_04 = iVar10;
        break;
      case EST_XNormal:
        iVar9 = iVar9 + 1;
        local_94 = (float)pPVar2->eType;
        idx_02 = iVar10;
        break;
      case EST_YNormal:
        iVar9 = iVar9 + 1;
        local_4c = pPVar2->eType;
        local_74 = iVar10;
        break;
      case EST_ZNormal:
        iVar9 = iVar9 + 1;
        local_48 = pPVar2->eType;
        local_88 = (float)iVar10;
        break;
      case EST_UTextureCoord:
        iVar9 = iVar9 + 1;
        eType_00 = pPVar2->eType;
        local_6c = iVar10;
        break;
      case EST_VTextureCoord:
        iVar9 = iVar9 + 1;
        eType = pPVar2->eType;
        idx_01 = iVar10;
        break;
      case EST_Red:
        iVar9 = iVar9 + 1;
        local_44 = pPVar2->eType;
        local_70 = iVar10;
        break;
      case EST_Green:
        iVar9 = iVar9 + 1;
        local_78 = pPVar2->eType;
        local_84 = (float)iVar10;
        break;
      case EST_Blue:
        iVar9 = iVar9 + 1;
        local_90 = (float)pPVar2->eType;
        local_80 = iVar10;
        break;
      case EST_Alpha:
        iVar9 = iVar9 + 1;
        local_8c = (float)pPVar2->eType;
        idx_03 = iVar10;
      }
    }
    iVar10 = iVar10 + 1;
  }
  if (iVar9 != 0) {
    local_58 = 0.0;
    local_5c = 0.0;
    if (idx_00 != -1) {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,idx_00);
      local_5c = PLY::PropertyInstance::ConvertTo<float>
                           (*(pPVar3->avList).
                             super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start,local_50);
    }
    if (idx != -1) {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,idx);
      local_58 = PLY::PropertyInstance::ConvertTo<float>
                           (*(pPVar3->avList).
                             super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start,(EDataType)local_98);
    }
    fVar13 = 0.0;
    local_98 = 0.0;
    if (idx_04 != -1) {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,idx_04);
      fVar13 = PLY::PropertyInstance::ConvertTo<float>
                         (*(pPVar3->avList).
                           super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start,local_7c);
    }
    if (idx_02 != -1) {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,idx_02);
      local_98 = PLY::PropertyInstance::ConvertTo<float>
                           (*(pPVar3->avList).
                             super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start,(EDataType)local_94);
    }
    fVar14 = 0.0;
    local_94 = 0.0;
    if (local_74 != -1) {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,local_74);
      fVar14 = PLY::PropertyInstance::ConvertTo<float>
                         (*(pPVar3->avList).
                           super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start,local_4c);
    }
    bVar11 = local_88 != -NAN;
    if (bVar11) {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,(int)local_88);
      local_94 = PLY::PropertyInstance::ConvertTo<float>
                           (*(pPVar3->avList).
                             super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start,local_48);
    }
    fVar15 = 0.0;
    local_88 = 0.0;
    if (local_70 != -1) {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,local_70);
      fVar15 = NormalizeColorValue(*(pPVar3->avList).
                                    super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                    ._M_impl.super__Vector_impl_data._M_start,local_44);
    }
    bVar12 = local_84 != -NAN;
    if (bVar12) {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,(int)local_84);
      local_88 = NormalizeColorValue(*(pPVar3->avList).
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                      ._M_impl.super__Vector_impl_data._M_start,local_78);
    }
    if (local_80 == -1) {
      local_90 = 0.0;
    }
    else {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,local_80);
      local_90 = NormalizeColorValue(*(pPVar3->avList).
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                      ._M_impl.super__Vector_impl_data._M_start,(EDataType)local_90)
      ;
    }
    if (idx_03 == -1) {
      local_8c = 1.0;
    }
    else {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,idx_03);
      local_8c = NormalizeColorValue(*(pPVar3->avList).
                                      super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                                      ._M_impl.super__Vector_impl_data._M_start,(EDataType)local_8c)
      ;
    }
    fVar16 = 0.0;
    local_84 = 0.0;
    if (local_6c != -1) {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,local_6c);
      fVar16 = PLY::PropertyInstance::ConvertTo<float>
                         (*(pPVar3->avList).
                           super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start,eType_00);
    }
    if (idx_01 != -1) {
      pPVar3 = anon_unknown.dwarf_906b4c::GetProperty<Assimp::PLY::PropertyInstance>
                         (&instElement->alProperties,idx_01);
      local_84 = PLY::PropertyInstance::ConvertTo<float>
                           (*(pPVar3->avList).
                             super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start,eType);
    }
    paVar4 = this->mGeneratedMesh;
    if (paVar4 == (aiMesh *)0x0) {
      paVar4 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar4);
      this->mGeneratedMesh = paVar4;
      paVar4->mMaterialIndex = 0;
    }
    paVar5 = paVar4->mVertices;
    if (paVar5 == (aiVector3D *)0x0) {
      paVar4->mNumVertices = pcElement->NumOccur;
      paVar4 = this->mGeneratedMesh;
      uVar8 = (ulong)paVar4->mNumVertices;
      uVar7 = uVar8 * 0xc;
      paVar5 = (aiVector3D *)operator_new__(uVar7);
      if (uVar8 != 0) {
        uVar7 = uVar7 - 0xc;
        memset(paVar5,0,(uVar7 - uVar7 % 0xc) + 0xc);
      }
      paVar4->mVertices = paVar5;
      paVar5 = this->mGeneratedMesh->mVertices;
    }
    paVar5[pos].x = local_5c;
    paVar5[pos].y = local_58;
    paVar5[pos].z = fVar13;
    if (bVar11 || (local_74 != -1 || idx_02 != -1)) {
      paVar4 = this->mGeneratedMesh;
      paVar5 = paVar4->mNormals;
      if (paVar5 == (aiVector3D *)0x0) {
        uVar1 = paVar4->mNumVertices;
        uVar7 = (ulong)uVar1 * 0xc;
        paVar5 = (aiVector3D *)operator_new__(uVar7);
        if ((ulong)uVar1 != 0) {
          uVar7 = uVar7 - 0xc;
          memset(paVar5,0,(uVar7 - uVar7 % 0xc) + 0xc);
        }
        paVar4->mNormals = paVar5;
        paVar5 = this->mGeneratedMesh->mNormals;
      }
      paVar5[pos].x = local_98;
      paVar5[pos].y = fVar14;
      paVar5[pos].z = local_94;
    }
    if (idx_03 != -1 || (local_80 != -1 || (bVar12 || local_70 != -1))) {
      paVar4 = this->mGeneratedMesh;
      paVar6 = paVar4->mColors[0];
      if (paVar6 == (aiColor4D *)0x0) {
        uVar1 = paVar4->mNumVertices;
        uVar7 = (ulong)uVar1 << 4;
        paVar6 = (aiColor4D *)operator_new__(uVar7);
        if ((ulong)uVar1 != 0) {
          memset(paVar6,0,uVar7);
        }
        paVar4->mColors[0] = paVar6;
        paVar6 = this->mGeneratedMesh->mColors[0];
      }
      paVar6[pos].r = fVar15;
      paVar6[pos].g = local_88;
      paVar6[pos].b = local_90;
      paVar6[pos].a = local_8c;
    }
    if (idx_01 != -1 || local_6c != -1) {
      paVar5 = this->mGeneratedMesh->mTextureCoords[0];
      if (paVar5 == (aiVector3D *)0x0) {
        this->mGeneratedMesh->mNumUVComponents[0] = 2;
        paVar4 = this->mGeneratedMesh;
        uVar8 = (ulong)paVar4->mNumVertices;
        uVar7 = uVar8 * 0xc;
        paVar5 = (aiVector3D *)operator_new__(uVar7);
        if (uVar8 != 0) {
          uVar7 = uVar7 - 0xc;
          memset(paVar5,0,(uVar7 - uVar7 % 0xc) + 0xc);
        }
        paVar4->mTextureCoords[0] = paVar5;
        paVar5 = this->mGeneratedMesh->mTextureCoords[0];
      }
      paVar5[pos].x = fVar16;
      paVar5[pos].y = local_84;
      paVar5[pos].z = 0.0;
    }
  }
  return;
}

Assistant:

void PLYImporter::LoadVertex(const PLY::Element* pcElement, const PLY::ElementInstance* instElement, unsigned int pos) {
    ai_assert(nullptr != pcElement);
    ai_assert(nullptr != instElement);

    ai_uint aiPositions[3] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiTypes[3] = { EDT_Char, EDT_Char, EDT_Char };

    ai_uint aiNormal[3] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiNormalTypes[3] = { EDT_Char, EDT_Char, EDT_Char };

    unsigned int aiColors[4] = { 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiColorsTypes[4] = { EDT_Char, EDT_Char, EDT_Char, EDT_Char };

    unsigned int aiTexcoord[2] = { 0xFFFFFFFF, 0xFFFFFFFF };
    PLY::EDataType aiTexcoordTypes[2] = { EDT_Char, EDT_Char };

    // now check whether which normal components are available
    unsigned int _a( 0 ), cnt( 0 );
    for ( std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
            a != pcElement->alProperties.end(); ++a, ++_a) {
        if ((*a).bIsList) {
            continue;
        }

        // Positions
        if (PLY::EST_XCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[0] = _a;
            aiTypes[0] = (*a).eType;
        } else if (PLY::EST_YCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[1] = _a;
            aiTypes[1] = (*a).eType;
        } else if (PLY::EST_ZCoord == (*a).Semantic) {
            ++cnt;
            aiPositions[2] = _a;
            aiTypes[2] = (*a).eType;
        } else if (PLY::EST_XNormal == (*a).Semantic) {
            // Normals
            ++cnt;
            aiNormal[0] = _a;
            aiNormalTypes[0] = (*a).eType;
        } else if (PLY::EST_YNormal == (*a).Semantic) {
            ++cnt;
            aiNormal[1] = _a;
            aiNormalTypes[1] = (*a).eType;
        } else if (PLY::EST_ZNormal == (*a).Semantic) {
            ++cnt;
            aiNormal[2] = _a;
            aiNormalTypes[2] = (*a).eType;
        } else if (PLY::EST_Red == (*a).Semantic) {
            // Colors
            ++cnt;
            aiColors[0] = _a;
            aiColorsTypes[0] = (*a).eType;
        } else if (PLY::EST_Green == (*a).Semantic) {
            ++cnt;
            aiColors[1] = _a;
            aiColorsTypes[1] = (*a).eType;
        } else if (PLY::EST_Blue == (*a).Semantic) {
            ++cnt;
            aiColors[2] = _a;
            aiColorsTypes[2] = (*a).eType;
        } else if (PLY::EST_Alpha == (*a).Semantic) {
            ++cnt;
            aiColors[3] = _a;
            aiColorsTypes[3] = (*a).eType;
        } else if (PLY::EST_UTextureCoord == (*a).Semantic) {
            // Texture coordinates
            ++cnt;
            aiTexcoord[0] = _a;
            aiTexcoordTypes[0] = (*a).eType;
        } else if (PLY::EST_VTextureCoord == (*a).Semantic) {
            ++cnt;
            aiTexcoord[1] = _a;
            aiTexcoordTypes[1] = (*a).eType;
        }
    }

    // check whether we have a valid source for the vertex data
    if (0 != cnt) {
        // Position
        aiVector3D vOut;
        if (0xFFFFFFFF != aiPositions[0]) {
            vOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[0]).avList.front(), aiTypes[0]);
        }

        if (0xFFFFFFFF != aiPositions[1]) {
            vOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[1]).avList.front(), aiTypes[1]);
        }

        if (0xFFFFFFFF != aiPositions[2]) {
            vOut.z = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiPositions[2]).avList.front(), aiTypes[2]);
        }

        // Normals
        aiVector3D nOut;
        bool haveNormal = false;
        if (0xFFFFFFFF != aiNormal[0]) {
            nOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[0]).avList.front(), aiNormalTypes[0]);
            haveNormal = true;
        }

        if (0xFFFFFFFF != aiNormal[1]) {
            nOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[1]).avList.front(), aiNormalTypes[1]);
            haveNormal = true;
        }

        if (0xFFFFFFFF != aiNormal[2]) {
            nOut.z = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiNormal[2]).avList.front(), aiNormalTypes[2]);
            haveNormal = true;
        }

        //Colors
        aiColor4D cOut;
        bool haveColor = false;
        if (0xFFFFFFFF != aiColors[0]) {
            cOut.r = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[0]).avList.front(), aiColorsTypes[0]);
            haveColor = true;
        }

        if (0xFFFFFFFF != aiColors[1]) {
            cOut.g = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[1]).avList.front(), aiColorsTypes[1]);
            haveColor = true;
        }

        if (0xFFFFFFFF != aiColors[2]) {
            cOut.b = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[2]).avList.front(), aiColorsTypes[2]);
            haveColor = true;
        }

        // assume 1.0 for the alpha channel if it is not set
        if (0xFFFFFFFF == aiColors[3]) {
            cOut.a = 1.0;
        } else {
            cOut.a = NormalizeColorValue(GetProperty(instElement->alProperties,
                aiColors[3]).avList.front(), aiColorsTypes[3]);

            haveColor = true;
        }

        //Texture coordinates
        aiVector3D tOut;
        tOut.z = 0;
        bool haveTextureCoords = false;
        if (0xFFFFFFFF != aiTexcoord[0]) {
            tOut.x = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiTexcoord[0]).avList.front(), aiTexcoordTypes[0]);
            haveTextureCoords = true;
        }

        if (0xFFFFFFFF != aiTexcoord[1]) {
            tOut.y = PLY::PropertyInstance::ConvertTo<ai_real>(
                GetProperty(instElement->alProperties, aiTexcoord[1]).avList.front(), aiTexcoordTypes[1]);
            haveTextureCoords = true;
        }

        //create aiMesh if needed
        if ( nullptr == mGeneratedMesh ) {
            mGeneratedMesh = new aiMesh();
            mGeneratedMesh->mMaterialIndex = 0;
        }

        if (nullptr == mGeneratedMesh->mVertices) {
            mGeneratedMesh->mNumVertices = pcElement->NumOccur;
            mGeneratedMesh->mVertices = new aiVector3D[mGeneratedMesh->mNumVertices];
        }

        mGeneratedMesh->mVertices[pos] = vOut;

        if (haveNormal) {
            if (nullptr == mGeneratedMesh->mNormals)
                mGeneratedMesh->mNormals = new aiVector3D[mGeneratedMesh->mNumVertices];
            mGeneratedMesh->mNormals[pos] = nOut;
        }

        if (haveColor) {
            if (nullptr == mGeneratedMesh->mColors[0])
                mGeneratedMesh->mColors[0] = new aiColor4D[mGeneratedMesh->mNumVertices];
            mGeneratedMesh->mColors[0][pos] = cOut;
        }

        if (haveTextureCoords) {
            if (nullptr == mGeneratedMesh->mTextureCoords[0]) {
                mGeneratedMesh->mNumUVComponents[0] = 2;
                mGeneratedMesh->mTextureCoords[0] = new aiVector3D[mGeneratedMesh->mNumVertices];
            }
            mGeneratedMesh->mTextureCoords[0][pos] = tOut;
        }
    }
}